

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O0

void array_container_offset
               (array_container_t *c,container_t **loc,container_t **hic,uint16_t offset)

{
  int iVar1;
  int iVar2;
  int iVar3;
  array_container_t *paVar4;
  ushort in_CX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  int *in_RDI;
  int i_1;
  int i;
  int hi_cap;
  int lo_cap;
  int top;
  array_container_t *hi;
  array_container_t *lo;
  int32_t in_stack_ffffffffffffffbc;
  undefined2 in_stack_ffffffffffffffc0;
  uint16_t in_stack_ffffffffffffffc2;
  int32_t in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  
  iVar1 = count_less((uint16_t *)CONCAT44(0x10000 - (uint)in_CX,in_stack_ffffffffffffffc8),
                     in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc2);
  iVar2 = CONCAT22(in_stack_ffffffffffffffc2,in_stack_ffffffffffffffc0);
  if ((in_RSI != (undefined8 *)0x0) &&
     (iVar2 = CONCAT22(in_stack_ffffffffffffffc2,in_stack_ffffffffffffffc0), iVar1 != 0)) {
    paVar4 = array_container_create_given_capacity(in_stack_ffffffffffffffbc);
    for (iVar2 = 0; iVar2 < iVar1; iVar2 = iVar2 + 1) {
      array_container_add((array_container_t *)CONCAT44(in_stack_ffffffffffffffc4,iVar2),
                          (uint16_t)((uint)in_stack_ffffffffffffffbc >> 0x10));
    }
    *in_RSI = paVar4;
  }
  iVar3 = *in_RDI - iVar1;
  if ((in_RDX != (undefined8 *)0x0) && (iVar3 != 0)) {
    paVar4 = array_container_create_given_capacity(in_stack_ffffffffffffffbc);
    for (; iVar1 < *in_RDI; iVar1 = iVar1 + 1) {
      array_container_add((array_container_t *)CONCAT44(iVar3,iVar2),(uint16_t)((uint)iVar1 >> 0x10)
                         );
    }
    *in_RDX = paVar4;
  }
  return;
}

Assistant:

void array_container_offset(const array_container_t *c, container_t **loc,
                            container_t **hic, uint16_t offset) {
    array_container_t *lo = NULL, *hi = NULL;
    int top, lo_cap, hi_cap;

    top = (1 << 16) - offset;

    lo_cap = count_less(c->array, c->cardinality, top);
    if (loc && lo_cap) {
        lo = array_container_create_given_capacity(lo_cap);
        for (int i = 0; i < lo_cap; ++i) {
            array_container_add(lo, c->array[i] + offset);
        }
        *loc = (container_t *)lo;
    }

    hi_cap = c->cardinality - lo_cap;
    if (hic && hi_cap) {
        hi = array_container_create_given_capacity(hi_cap);
        for (int i = lo_cap; i < c->cardinality; ++i) {
            array_container_add(hi, c->array[i] + offset);
        }
        *hic = (container_t *)hi;
    }
}